

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

Function * __thiscall LinkedObjectFile::get_function_at_label(LinkedObjectFile *this,int label_id)

{
  bool bVar1;
  reference pFVar2;
  vector<Label,_std::allocator<Label>_> *in_RDI;
  Function *func;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  value_type *label;
  vector<Function,_std::allocator<Function>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_> local_28;
  reference local_20;
  reference local_18;
  
  local_18 = std::vector<Label,_std::allocator<Label>_>::at
                       (in_RDI,(size_type)in_stack_ffffffffffffffb8);
  local_20 = std::
             vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   *)in_RDI,(size_type)in_stack_ffffffffffffffb8);
  local_28._M_current =
       (Function *)
       std::vector<Function,_std::allocator<Function>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<Function,_std::allocator<Function>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                        *)in_RDI,
                       (__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x5c,"Function &LinkedObjectFile::get_function_at_label(int)");
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
             operator*(&local_28);
    if (pFVar2->start_word * 4 + 4 == local_18->offset) break;
    __gnu_cxx::__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
    operator++(&local_28);
  }
  return pFVar2;
}

Assistant:

Function& LinkedObjectFile::get_function_at_label(int label_id) {
  auto& label = labels.at(label_id);
  for (auto& func : functions_by_seg.at(label.target_segment)) {
    // + 4 to skip past type tag to the first word, which is were the label points.
    if (func.start_word * 4 + 4 == label.offset) {
      return func;
    }
  }

  assert(false);
  return functions_by_seg.front().front(); // to avoid error
}